

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O2

bool __thiscall flow::diagnostics::Message::operator==(Message *this,Message *other)

{
  bool bVar1;
  __type_conflict2 _Var2;
  
  if (this->type == other->type) {
    bVar1 = FilePos::operator==(&(this->sourceLocation).begin,&(other->sourceLocation).begin);
    if (bVar1) {
      _Var2 = std::operator==(&this->text,&other->text);
      return _Var2;
    }
  }
  return false;
}

Assistant:

bool Message::operator==(const Message& other) const noexcept {
  // XXX ignore SourceLocation's filename & end
  return type == other.type &&
         sourceLocation.begin == other.sourceLocation.begin &&
         text == other.text;
}